

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadUInt
          (BinaryReader<mp::internal::IdentityConverter> *this)

{
  int iVar1;
  
  iVar1 = ReadInt<int>(this);
  if (iVar1 < 0) {
    BinaryReaderBase::ReportError<>(&this->super_BinaryReaderBase,(CStringRef)0x2c0167);
  }
  return iVar1;
}

Assistant:

int ReadUInt() {
    int value = ReadInt<int>();
    if (value < 0)
      ReportError("expected unsigned integer");
    return value;
  }